

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llex.c
# Opt level: O0

unsigned_long readutf8esc(LexState *ls)

{
  size_t sVar1;
  byte *pbVar2;
  int iVar3;
  uint local_34;
  uint local_24;
  uint local_20;
  int local_1c;
  ulong uStack_18;
  int i;
  unsigned_long r;
  LexState *ls_local;
  
  local_1c = 4;
  save(ls,ls->current);
  sVar1 = ls->z->n;
  ls->z->n = sVar1 - 1;
  if (sVar1 == 0) {
    local_20 = luaZ_fill(ls->z);
  }
  else {
    pbVar2 = (byte *)ls->z->p;
    ls->z->p = (char *)(pbVar2 + 1);
    local_20 = (uint)*pbVar2;
  }
  ls->current = local_20;
  esccheck(ls,(uint)(ls->current == 0x7b),"missing \'{\'");
  iVar3 = gethexa(ls);
  uStack_18 = (ulong)iVar3;
  while( true ) {
    save(ls,ls->current);
    sVar1 = ls->z->n;
    ls->z->n = sVar1 - 1;
    if (sVar1 == 0) {
      local_24 = luaZ_fill(ls->z);
    }
    else {
      pbVar2 = (byte *)ls->z->p;
      ls->z->p = (char *)(pbVar2 + 1);
      local_24 = (uint)*pbVar2;
    }
    ls->current = local_24;
    if ((""[ls->current + 1] & 0x10) == 0) break;
    local_1c = local_1c + 1;
    iVar3 = luaO_hexavalue(ls->current);
    uStack_18 = uStack_18 * 0x10 + (long)iVar3;
    esccheck(ls,(uint)(uStack_18 < 0x110000),"UTF-8 value too large");
  }
  esccheck(ls,(uint)(ls->current == 0x7d),"missing \'}\'");
  sVar1 = ls->z->n;
  ls->z->n = sVar1 - 1;
  if (sVar1 == 0) {
    local_34 = luaZ_fill(ls->z);
  }
  else {
    pbVar2 = (byte *)ls->z->p;
    ls->z->p = (char *)(pbVar2 + 1);
    local_34 = (uint)*pbVar2;
  }
  ls->current = local_34;
  ls->buff->n = ls->buff->n - (long)local_1c;
  return uStack_18;
}

Assistant:

static unsigned long readutf8esc (LexState *ls) {
  unsigned long r;
  int i = 4;  /* chars to be removed: '\', 'u', '{', and first digit */
  save_and_next(ls);  /* skip 'u' */
  esccheck(ls, ls->current == '{', "missing '{'");
  r = gethexa(ls);  /* must have at least one digit */
  while ((save_and_next(ls), lisxdigit(ls->current))) {
    i++;
    r = (r << 4) + luaO_hexavalue(ls->current);
    esccheck(ls, r <= 0x10FFFF, "UTF-8 value too large");
  }
  esccheck(ls, ls->current == '}', "missing '}'");
  next(ls);  /* skip '}' */
  luaZ_buffremove(ls->buff, i);  /* remove saved chars from buffer */
  return r;
}